

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcZone::~IfcZone(IfcZone *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject = 0x86c028;
  *(undefined8 *)&(this->super_IfcGroup).field_0xf0 = 0x86c0a0;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0x88 = 0x86c050;
  (this->super_IfcGroup).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0x86c078;
  puVar2 = *(undefined1 **)
            &(this->super_IfcGroup).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  puVar1 = &(this->super_IfcGroup).super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject = 0x86c140;
  *(undefined8 *)&(this->super_IfcGroup).field_0xf0 = 0x86c168;
  puVar2 = *(undefined1 **)&(this->super_IfcGroup).super_IfcObject.field_0x60;
  puVar1 = &(this->super_IfcGroup).super_IfcObject.field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcGroup).super_IfcObject.field_0x38;
  puVar1 = &(this->super_IfcGroup).super_IfcObject.field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcGroup).super_IfcObject.field_0x10;
  puVar1 = &(this->super_IfcGroup).super_IfcObject.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0x108);
  return;
}

Assistant:

IfcZone() : Object("IfcZone") {}